

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O1

Error __thiscall asmjit::CodeHolder::flatten(CodeHolder *this)

{
  void *pvVar1;
  long lVar2;
  bool bVar3;
  Error EVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  pvVar1 = (this->_sectionsByOrder).super_ZoneVectorBase._data;
  uVar6 = (ulong)(this->_sectionsByOrder).super_ZoneVectorBase._size;
  bVar11 = uVar6 == 0;
  if (!bVar11) {
    lVar7 = 0;
    uVar10 = 0;
    do {
      lVar5 = *(long *)((long)pvVar1 + lVar7);
      uVar8 = *(ulong *)(lVar5 + 0x50);
      if (*(ulong *)(lVar5 + 0x50) < *(ulong *)(lVar5 + 0x18)) {
        uVar8 = *(ulong *)(lVar5 + 0x18);
      }
      if (uVar8 == 0) {
        bVar3 = true;
      }
      else {
        uVar9 = -(ulong)*(uint *)(lVar5 + 8) & (uVar10 + *(uint *)(lVar5 + 8)) - 1;
        if (uVar9 < uVar10) {
          bVar3 = false;
        }
        else {
          uVar10 = uVar9 + uVar8;
          bVar3 = !CARRY8(uVar9,uVar8);
        }
      }
      if (!bVar3) break;
      lVar7 = lVar7 + 8;
      bVar11 = uVar6 * 8 - lVar7 == 0;
    } while (!bVar11);
  }
  EVar4 = 9;
  if (bVar11) {
    if (uVar6 != 0) {
      lVar5 = 0;
      uVar10 = 0;
      lVar7 = 0;
      do {
        lVar2 = *(long *)((long)pvVar1 + lVar5);
        uVar8 = *(ulong *)(lVar2 + 0x50);
        if (*(ulong *)(lVar2 + 0x50) < *(ulong *)(lVar2 + 0x18)) {
          uVar8 = *(ulong *)(lVar2 + 0x18);
        }
        if (uVar8 != 0) {
          uVar10 = -(ulong)*(uint *)(lVar2 + 8) & (uVar10 + *(uint *)(lVar2 + 8)) - 1;
        }
        *(ulong *)(lVar2 + 0x10) = uVar10;
        if (lVar7 != 0) {
          *(ulong *)(lVar7 + 0x18) = uVar10 - *(long *)(lVar7 + 0x10);
        }
        uVar10 = uVar10 + uVar8;
        lVar5 = lVar5 + 8;
        lVar7 = lVar2;
      } while (uVar6 << 3 != lVar5);
    }
    EVar4 = 0;
  }
  return EVar4;
}

Assistant:

inline T* data() noexcept { return static_cast<T*>(_data); }